

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O3

StmNode * __thiscall Translator::visit(Translator *this,SwitchNode *switchNode)

{
  CaseBlockNode *pCVar1;
  CaseBlockNode *pCVar2;
  int iVar3;
  int i;
  Label *this_00;
  Label *this_01;
  SEQ *pSVar4;
  LABEL *pLVar5;
  LABEL *pLVar6;
  SEQ *this_02;
  CJUMP *this_03;
  undefined4 extraout_var;
  ExprNode *right;
  SEQ *this_04;
  SEQ *this_05;
  undefined4 extraout_var_00;
  char startLabelName [200];
  char endlabelName [200];
  CaseBlockNode *local_1f0;
  Label *local_1e8;
  Label *local_1e0;
  Translator *local_1d8;
  SEQ *local_1d0;
  char local_1c8 [208];
  char local_f8 [200];
  
  local_1f0 = (CaseBlockNode *)switchNode;
  local_1d8 = this;
  sprintf(local_f8,"switch_end_%p");
  local_1e0 = (Label *)operator_new(0x10);
  Label::Label(local_1e0,local_f8);
  sprintf(local_1c8,"switch_start_%p",&local_1f0);
  local_1e8 = (Label *)operator_new(0x10);
  Label::Label(local_1e8,local_1c8);
  pSVar4 = (SEQ *)0x0;
  pCVar1 = local_1f0;
  while( true ) {
    pCVar1 = pCVar1->next;
    local_1d0 = pSVar4;
    if (pCVar1 == (CaseBlockNode *)0x0) break;
    this_00 = (Label *)operator_new(0x10);
    Label::Label(this_00);
    this_01 = (Label *)operator_new(0x10);
    Label::Label(this_01);
    pCVar2 = pCVar1->next;
    pSVar4 = (SEQ *)operator_new(0x20);
    if (pCVar2 == (CaseBlockNode *)0x0) {
      pLVar5 = (LABEL *)operator_new(0x18);
      LABEL::LABEL(pLVar5,this_00);
      pLVar6 = (LABEL *)operator_new(0x18);
      LABEL::LABEL(pLVar6,local_1e0);
      SEQ::SEQ(pSVar4,(StmNode *)pLVar5,(StmNode *)pLVar6);
    }
    else {
      pLVar5 = (LABEL *)operator_new(0x18);
      LABEL::LABEL(pLVar5,this_00);
      pLVar6 = (LABEL *)operator_new(0x18);
      LABEL::LABEL(pLVar6,this_01);
      SEQ::SEQ(pSVar4,(StmNode *)pLVar5,(StmNode *)pLVar6);
    }
    this_02 = (SEQ *)operator_new(0x20);
    this_03 = (CJUMP *)operator_new(0x30);
    iVar3 = (*(((ExpNode *)local_1f0->stmt)->super_StmtNode).super_ASTNode._vptr_ASTNode[4])
                      ((ExpNode *)local_1f0->stmt,local_1d8);
    right = (ExprNode *)operator_new(0x10);
    i = atoi((pCVar1->num->super_ExpNode).lexeme);
    CONST::CONST((CONST *)right,i);
    CJUMP::CJUMP(this_03,3,(ExprNode *)CONCAT44(extraout_var,iVar3),right,this_01,this_00);
    this_04 = (SEQ *)operator_new(0x20);
    pLVar5 = (LABEL *)operator_new(0x18);
    LABEL::LABEL(pLVar5,this_01);
    this_05 = (SEQ *)operator_new(0x20);
    iVar3 = (*(pCVar1->stmt->super_StmtNode).super_ASTNode._vptr_ASTNode[4])(pCVar1->stmt,local_1d8)
    ;
    SEQ::SEQ(this_05,(StmNode *)CONCAT44(extraout_var_00,iVar3),(StmNode *)pSVar4);
    SEQ::SEQ(this_04,(StmNode *)pLVar5,(StmNode *)this_05);
    SEQ::SEQ(this_02,(StmNode *)this_03,(StmNode *)this_04);
    pSVar4 = (SEQ *)operator_new(0x20);
    SEQ::SEQ(pSVar4,&local_1d0->super_StmNode,(StmNode *)this_02);
  }
  pSVar4 = (SEQ *)operator_new(0x20);
  pLVar5 = (LABEL *)operator_new(0x18);
  LABEL::LABEL(pLVar5,local_1e8);
  SEQ::SEQ(pSVar4,(StmNode *)pLVar5,&local_1d0->super_StmNode);
  return &pSVar4->super_StmNode;
}

Assistant:

StmNode *Translator::visit(SwitchNode *switchNode) {
    char endlabelName[200];
    char startLabelName[200];

    //criando o label do fim  do switch
    sprintf(endlabelName, "switch_end_%p", &switchNode);
    Label *labelSwitchEnd = new Label(endlabelName);

    sprintf(startLabelName, "switch_start_%p", &switchNode);
    Label *labelSwitchStart = new Label(startLabelName);

    //pego o primeiro bloco do switch
    CaseBlockNode *caseBlock = switchNode->getBlock();

    // variaveis auxiliares
    SEQ *seq2 = NULL, *seq = NULL, *seqAUX = NULL;

    //enquanto houver blocos
    while (caseBlock) {
        //labels auxiliares
        Label *labelEndCase = new Label();
        Label *labelCase = new Label();

        //se tem um proximo bloco no switch
        if (caseBlock->getNext()) {
            // o seq 2 recebe um label de continuacao e um no SEQ nulo
            seq2 = new SEQ(new LABEL(labelEndCase), new LABEL(labelCase));
        } else {
            // caso contrario, o seq2 recebe o label de continuacao e de fim
            seq2 = new SEQ(new LABEL(labelEndCase), new LABEL(labelSwitchEnd));
        }

        // seq recebe o cjump pra expressao do switch, o int pro bloco, o label do case, o label da continuacao e
        // recebe o label do case e recebe as sentencas do bloco e o bloco 3
        seqAUX = new SEQ(new CJUMP(EQ, switchNode->getExp()->accept(this),
                                   new CONST(atoi(caseBlock->getNum()->getLexeme())), labelCase, labelEndCase),
                         new SEQ(new LABEL(labelCase),
                                 new SEQ(caseBlock->getStmt()->accept(this), seq2)));
        seq = new SEQ(seq, seqAUX);
        caseBlock = caseBlock->getNext();
    }
    seq = new SEQ(new LABEL(labelSwitchStart), seq);
    return seq;
}